

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int enter_close(quicly_conn_t *conn,int param_2,int wait_draining)

{
  quicly_sentmap_t *map;
  uint64_t *puVar1;
  int iVar2;
  quicly_sent_t *pqVar3;
  int64_t iVar4;
  long lVar5;
  
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    __assert_fail("conn->super.state < QUICLY_STATE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x11d2,"int enter_close(quicly_conn_t *, int, int)");
  }
  iVar2 = discard_sentmap_by_epoch(conn,0xffffffff);
  if (iVar2 != 0) {
    return iVar2;
  }
  map = &(conn->egress).loss.sentmap;
  iVar2 = quicly_sentmap_prepare(map,(conn->egress).packet_number,(conn->stash).now,'\0');
  if (iVar2 != 0) {
    return iVar2;
  }
  pqVar3 = quicly_sentmap_allocate(map,on_end_closing);
  if (pqVar3 == (quicly_sent_t *)0x0) {
    return 0x201;
  }
  quicly_sentmap_commit(map,0);
  puVar1 = &(conn->egress).packet_number;
  *puVar1 = *puVar1 + 1;
  if (param_2 == 0) {
    (conn->super).state = QUICLY_STATE_DRAINING;
    if (wait_draining != 0) {
      lVar5 = (conn->stash).now;
      iVar4 = get_sentmap_expiration_time(conn);
      lVar5 = iVar4 + lVar5;
      goto LAB_0011e8ab;
    }
  }
  else {
    (conn->super).state = QUICLY_STATE_CLOSING;
  }
  lVar5 = 0;
LAB_0011e8ab:
  (conn->egress).send_ack_at = lVar5;
  update_loss_alarm(conn,0);
  return 0;
}

Assistant:

static int enter_close(quicly_conn_t *conn, int local_is_initiating, int wait_draining)
{
    int ret;

    assert(conn->super.state < QUICLY_STATE_CLOSING);

    /* release all inflight info, register a close timeout */
    if ((ret = discard_sentmap_by_epoch(conn, ~0u)) != 0)
        return ret;
    if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                      QUICLY_EPOCH_INITIAL)) != 0)
        return ret;
    if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_end_closing) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
    ++conn->egress.packet_number;

    if (local_is_initiating) {
        conn->super.state = QUICLY_STATE_CLOSING;
        conn->egress.send_ack_at = 0;
    } else {
        conn->super.state = QUICLY_STATE_DRAINING;
        conn->egress.send_ack_at = wait_draining ? conn->stash.now + get_sentmap_expiration_time(conn) : 0;
    }

    update_loss_alarm(conn, 0);

    return 0;
}